

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDFaceCornerDex __thiscall ON_SubDComponentId::FaceCornerDex(ON_SubDComponentId *this)

{
  bool bVar1;
  uint corner_index;
  uint edge_count;
  ON_SubDComponentId *this_local;
  ON_SubDFaceCornerDex cid;
  
  bVar1 = IsFaceId(this);
  if (bVar1) {
    corner_index = Internal_ValueA(this);
    edge_count = Internal_ValueB(this);
    ON_SubDFaceCornerDex::ON_SubDFaceCornerDex
              ((ON_SubDFaceCornerDex *)((long)&this_local + 4),corner_index,edge_count);
    bVar1 = ON_SubDFaceCornerDex::IsSet((ON_SubDFaceCornerDex *)((long)&this_local + 4));
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  return ON_SubDFaceCornerDex::Unset;
}

Assistant:

const ON_SubDFaceCornerDex ON_SubDComponentId::FaceCornerDex() const
{
  if (IsFaceId())
  {
    const ON_SubDFaceCornerDex cid(this->Internal_ValueA(), this->Internal_ValueB());
    if (cid.IsSet())
      return cid;
  }
  return ON_SubDFaceCornerDex::Unset;
}